

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O3

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  VectorXd *this_01;
  long lVar1;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  DenseStorage<double,__1,__1,_1,_0> *__ptr;
  ulong uVar3;
  double dVar4;
  DenseIndex DVar5;
  DenseIndex DVar6;
  Index size;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar7;
  double *pdVar8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar9;
  ostream *poVar10;
  Index index;
  ulong uVar11;
  char *__function;
  long lVar12;
  invalid_argument e;
  VectorXd z;
  double y;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_e8;
  double local_c0;
  DenseStorage<double,__1,__1,_1,_0> local_b8;
  Scalar local_a8;
  double local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  double local_30;
  
  if (this->is_initialized_ == false) {
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar2 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar5 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar6 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar2;
    local_e8.m_row = DVar5;
    local_e8.m_col = DVar6;
    free(pMVar2);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_b8.m_data = (double *)0x0;
    local_e8.m_xpr = &(this->ekf_).P_;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_e8,(Scalar *)&local_b8);
    local_a8 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_a8);
    local_90 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_90);
    local_98 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_98);
    local_38 = 1.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_38);
    local_40 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_40);
    local_48 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_48);
    local_50 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_50);
    local_58 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_58);
    local_60 = 1000.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_60);
    local_68 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_68);
    local_70 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_70);
    local_78 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_78);
    local_80 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_80);
    local_88 = 1000.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar7,&local_88);
    pdVar8 = ((DenseStorage<double,__1,__1,_1,_0> *)((long)local_e8.m_xpr + 0x10))->m_data;
    if (local_e8.m_currentBlockRows + local_e8.m_row != *(DenseIndex *)((long)local_e8.m_xpr + 8)) {
      if (pdVar8 != (double *)0x0) goto LAB_00104aee;
      pdVar8 = (double *)0x0;
    }
    if ((double *)local_e8.m_col == pdVar8) {
      if (measurement_pack->sensor_type_ == LASER) {
        lVar12 = (measurement_pack->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (lVar12 < 1) goto LAB_00104b05;
        local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&(this->ekf_).x_;
        pdVar8 = (measurement_pack->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_e8.m_row = 0;
        local_e8.m_col = 1;
        local_e8.m_currentBlockRows = 1;
        *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data = *pdVar8;
        if (lVar12 == 1) goto LAB_00104b05;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                            pdVar8 + 1);
        local_b8.m_data = (double *)0x0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar9,(Scalar *)&local_b8);
        local_a8 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar9,&local_a8);
        if ((local_e8.m_currentBlockRows + local_e8.m_row ==
             *(DenseIndex *)((long)local_e8.m_xpr + 8)) &&
           ((double *)local_e8.m_col == (double *)0x1)) goto LAB_00104acc;
      }
      else {
        if (measurement_pack->sensor_type_ != RADAR) {
LAB_00104acc:
          this->previous_timestamp_ = measurement_pack->timestamp_;
          this->is_initialized_ = true;
          return;
        }
        uVar3 = (measurement_pack->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((((long)uVar3 < 1) || (uVar3 == 1)) || (uVar3 < 3)) goto LAB_00104b05;
        pdVar8 = (measurement_pack->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_c0 = *pdVar8;
        local_30 = pdVar8[1];
        local_a0 = cos(local_30);
        local_a0 = local_a0 * local_c0;
        local_a8 = sin(local_30);
        local_a8 = local_a8 * local_c0;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_b8,4,4,1);
        local_e8.m_row = 0;
        local_e8.m_col = 1;
        local_e8.m_currentBlockRows = 1;
        *local_b8.m_data = local_a0;
        local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&local_b8;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                            &local_a8);
        local_90 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar9,&local_90);
        local_98 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar9,&local_98);
        if ((local_e8.m_currentBlockRows + local_e8.m_row ==
             *(DenseIndex *)((long)local_e8.m_xpr + 8)) &&
           ((double *)local_e8.m_col == (double *)0x1)) {
          this_01 = &(this->ekf_).x_;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_01,
                     (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b8);
          uVar3 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          if (uVar3 != local_b8.m_rows) {
            __assert_fail("rows() == other.rows() && cols() == other.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/Assign.h"
                          ,0x1f9,
                          "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          uVar11 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar3) {
            lVar12 = 0;
            do {
              dVar4 = (local_b8.m_data + lVar12)[1];
              pdVar8 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + lVar12;
              *pdVar8 = local_b8.m_data[lVar12];
              pdVar8[1] = dVar4;
              lVar12 = lVar12 + 2;
            } while (lVar12 < (long)uVar11);
          }
          if ((long)uVar11 < (long)uVar3) {
            pdVar8 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            do {
              pdVar8[uVar11] = local_b8.m_data[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
          }
          free(local_b8.m_data);
          goto LAB_00104acc;
        }
      }
LAB_00104b24:
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00104b39;
    }
  }
  else {
    lVar12 = measurement_pack->timestamp_;
    lVar1 = this->previous_timestamp_;
    this->previous_timestamp_ = lVar12;
    local_e8.m_xpr = &(this->ekf_).F_;
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_b8.m_data = (double *)0x0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_e8,(Scalar *)&local_b8);
    local_c0 = (double)(float)((double)(lVar12 - lVar1) / 1000000.0);
    local_a8 = local_c0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_a8);
    local_90 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_90);
    local_98 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_98);
    local_38 = 1.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_38);
    local_40 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_40);
    local_48 = local_c0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_48);
    local_50 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_50);
    local_58 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_58);
    local_60 = 1.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_60);
    local_68 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_68);
    local_70 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_70);
    local_78 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_78);
    local_80 = 0.0;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar7,&local_80);
    local_88 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar7,&local_88);
    pdVar8 = ((DenseStorage<double,__1,__1,_1,_0> *)((long)local_e8.m_xpr + 0x10))->m_data;
    if (local_e8.m_currentBlockRows + local_e8.m_row != *(DenseIndex *)((long)local_e8.m_xpr + 8)) {
      if (pdVar8 != (double *)0x0) goto LAB_00104aee;
      pdVar8 = (double *)0x0;
    }
    if ((double *)local_e8.m_col == pdVar8) {
      local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
      local_e8.m_row = 0;
      local_e8.m_col = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
      pMVar2 = (Matrix<double,__1,__1,_0,__1,__1> *)
               (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_e8.m_xpr;
      DVar5 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      DVar6 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_e8.m_row;
      (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_e8.m_col;
      local_e8.m_xpr = pMVar2;
      local_e8.m_row = DVar5;
      local_e8.m_col = DVar6;
      free(pMVar2);
      dVar4 = pow(local_c0,4.0);
      local_e8.m_row = 0;
      local_e8.m_col = 1;
      local_e8.m_currentBlockRows = 1;
      *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data = (double)this->noise_ax * dVar4 * 0.25;
      local_b8.m_data = (double *)0x0;
      local_e8.m_xpr = &(this->ekf_).Q_;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_e8,(Scalar *)&local_b8);
      dVar4 = pow(local_c0,3.0);
      local_a8 = (double)this->noise_ax * dVar4 * 0.5;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_a8);
      local_90 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_90);
      local_98 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_98);
      dVar4 = pow(local_c0,4.0);
      local_38 = (double)this->noise_ay * dVar4 * 0.25;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_38);
      local_40 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_40);
      dVar4 = pow(local_c0,3.0);
      local_48 = (double)this->noise_ay * dVar4 * 0.5;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_48);
      dVar4 = pow(local_c0,3.0);
      local_50 = (double)this->noise_ax * dVar4 * 0.5;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_50);
      local_58 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_58);
      local_a0 = local_c0 * local_c0;
      local_60 = (double)this->noise_ax * local_a0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_60);
      local_68 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_68);
      local_70 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_70);
      dVar4 = pow(local_c0,3.0);
      local_78 = (double)this->noise_ay * dVar4 * 0.5;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_78);
      local_80 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar7,&local_80);
      local_88 = local_a0 * (double)this->noise_ay;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar7,&local_88);
      pdVar8 = ((DenseStorage<double,__1,__1,_1,_0> *)((long)local_e8.m_xpr + 0x10))->m_data;
      if (local_e8.m_currentBlockRows + local_e8.m_row != *(DenseIndex *)((long)local_e8.m_xpr + 8))
      {
        if (pdVar8 != (double *)0x0) goto LAB_00104aee;
        pdVar8 = (double *)0x0;
      }
      if ((double *)local_e8.m_col == pdVar8) {
        this_00 = &this->ekf_;
        KalmanFilter::Predict(this_00);
        if (measurement_pack->sensor_type_ == RADAR) {
          Tools::CalculateJacobian((MatrixXd *)&local_e8,&this->tools,&(this->ekf_).x_);
          __ptr = (DenseStorage<double,__1,__1,_1,_0> *)
                  (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
          (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)local_e8.m_xpr;
          DVar5 = (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          pdVar8 = (double *)
                   (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = local_e8.m_row;
          (this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = local_e8.m_col;
          local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)__ptr;
          local_e8.m_row = DVar5;
          local_e8.m_col = (Index)pdVar8;
          free(__ptr);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Hj_);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
          KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
LAB_00104993:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x_ = ",5);
          poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &(this->ekf_).x_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_ = ",5);
          poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &(this->ekf_).P_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          return;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_b8,2,2,1);
        lVar12 = (measurement_pack->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (lVar12 < 1) {
LAB_00104b05:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x9c,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        pdVar8 = (measurement_pack->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_e8.m_row = 0;
        local_e8.m_col = 1;
        local_e8.m_currentBlockRows = 1;
        *local_b8.m_data = *pdVar8;
        local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&local_b8;
        if (lVar12 == 1) goto LAB_00104b05;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,pdVar8 + 1
                  );
        if ((local_e8.m_currentBlockRows + local_e8.m_row ==
             *(DenseIndex *)((long)local_e8.m_xpr + 8)) &&
           ((double *)local_e8.m_col == (double *)0x1)) {
          KalmanFilter::Update(this_00,(VectorXd *)&local_b8);
          free(local_b8.m_data);
          goto LAB_00104993;
        }
        goto LAB_00104b24;
      }
    }
  }
LAB_00104aee:
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104b39:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {
  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {

    //state covariance matrix P
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      //Convert radar from polar to cartesian coordinates and initialize state.
      double ro = measurement_pack.raw_measurements_[0];
      double theta = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      double x = ro * std::cos(theta);
      double y = ro * std::sin(theta);

      VectorXd cartesian_measurement = VectorXd(4);
      cartesian_measurement << x, y, 0, 0;

      ekf_.x_ = cartesian_measurement;
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      //Initialize state.
      ekf_.x_ << measurement_pack.raw_measurements_[0],
          measurement_pack.raw_measurements_[1],
          0,
          0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;
  previous_timestamp_ = measurement_pack.timestamp_;

  // Modify the F matrix so that the time is integrated
  ekf_.F_ << 1, 0, dt, 0,
            0, 1, 0, dt,
            0, 0, 1, 0,
            0, 0, 0, 1;

  // Set the process covariance matrix Q
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ <<  (pow(dt, 4)/4)*noise_ax, 0, (pow(dt, 3)/2)*noise_ax, 0,
          0, (pow(dt, 4)/4)*noise_ay, 0, (pow(dt, 3)/2)*noise_ay,
          (pow(dt, 3)/2)*noise_ax, 0, (pow(dt, 2))*noise_ax, 0,
          0, (pow(dt, 3)/2)*noise_ay, 0, (pow(dt, 2))*noise_ay;

  // Call the Kalman Filter predict() function
  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    try {
      // Radar updates
      Hj_ = tools.CalculateJacobian(ekf_.x_);
      ekf_.H_ = Hj_;
      ekf_.R_ = R_radar_;
      ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    } catch (std::invalid_argument e) {
      cout << "Exception in radar update: " << e.what() << '\n';
    }
  } else {
    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    VectorXd z(2);
    z << measurement_pack.raw_measurements_[0],
        measurement_pack.raw_measurements_[1];
    ekf_.Update(z);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}